

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void vdbeSorterExtendFile(sqlite3 *db,sqlite3_file *pFd,i64 nByte)

{
  undefined4 local_2c;
  void *pvStack_28;
  int chunksize;
  void *p;
  i64 nByte_local;
  sqlite3_file *pFd_local;
  sqlite3 *db_local;
  
  if ((nByte <= db->nMaxSorterMmap) && (2 < pFd->pMethods->iVersion)) {
    pvStack_28 = (void *)0x0;
    local_2c = 0x1000;
    p = (void *)nByte;
    nByte_local = (i64)pFd;
    pFd_local = (sqlite3_file *)db;
    sqlite3OsFileControlHint(pFd,6,&local_2c);
    sqlite3OsFileControlHint((sqlite3_file *)nByte_local,5,&p);
    sqlite3OsFetch((sqlite3_file *)nByte_local,0,(int)p,&stack0xffffffffffffffd8);
    sqlite3OsUnfetch((sqlite3_file *)nByte_local,0,pvStack_28);
  }
  return;
}

Assistant:

static void vdbeSorterExtendFile(sqlite3 *db, sqlite3_file *pFd, i64 nByte){
  if( nByte<=(i64)(db->nMaxSorterMmap) && pFd->pMethods->iVersion>=3 ){
    void *p = 0;
    int chunksize = 4*1024;
    sqlite3OsFileControlHint(pFd, SQLITE_FCNTL_CHUNK_SIZE, &chunksize);
    sqlite3OsFileControlHint(pFd, SQLITE_FCNTL_SIZE_HINT, &nByte);
    sqlite3OsFetch(pFd, 0, (int)nByte, &p);
    sqlite3OsUnfetch(pFd, 0, p);
  }
}